

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitAlgorithms.cpp
# Opt level: O3

void __thiscall
Corrade::Utility::copyMasked
          (Utility *this,StridedArrayView2D<const_char> *src,BitArrayView srcMask,
          StridedArrayView2D<char> *dst)

{
  unsigned_long value;
  unsigned_long value_00;
  unsigned_long value_01;
  long lVar1;
  bool bVar2;
  type value_02;
  Debug *pDVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  void *__src;
  size_t i;
  void *__dest;
  ulong value_03;
  Error local_70;
  long local_48;
  BasicBitArrayView<const_char> local_40;
  
  puVar5 = (undefined8 *)srcMask._sizeOffset;
  local_40._sizeOffset = (size_t)srcMask._data;
  value = *(unsigned_long *)(this + 8);
  value_03 = local_40._sizeOffset >> 3;
  local_40._data = src;
  if (value == value_03) {
    value_02 = Containers::Implementation::bitCountSet();
    if (value_02 == (type)puVar5[1]) {
      value_00 = *(unsigned_long *)(this + 0x10);
      value_01 = puVar5[2];
      if (value_00 == value_01) {
        if (*(long *)(this + 0x20) == 1) {
          if (puVar5[4] == 1) {
            if (value != 0) {
              lVar1 = *(long *)(this + 0x18);
              local_48 = puVar5[3];
              __dest = (void *)*puVar5;
              __src = *(void **)this;
              i = 0;
              do {
                bVar2 = Containers::BasicBitArrayView<const_char>::operator[](&local_40,i);
                if (bVar2) {
                  memcpy(__dest,__src,value_00);
                  __dest = (void *)((long)__dest + local_48);
                }
                __src = (void *)((long)__src + lVar1);
                i = i + 1;
              } while (value != i);
            }
            return;
          }
          poVar4 = Error::defaultOutput();
          Error::Error(&local_70,poVar4,(Flags)0x0);
          Debug::operator<<(&local_70.super_Debug,
                            "Utility::copyMasked(): second destination view dimension is not contiguous"
                           );
        }
        else {
          poVar4 = Error::defaultOutput();
          Error::Error(&local_70,poVar4,(Flags)0x0);
          Debug::operator<<(&local_70.super_Debug,
                            "Utility::copyMasked(): second source view dimension is not contiguous")
          ;
        }
      }
      else {
        poVar4 = Error::defaultOutput();
        Error::Error(&local_70,poVar4,(Flags)0x0);
        pDVar3 = Debug::operator<<(&local_70.super_Debug,
                                   "Utility::copyMasked(): expected second destination dimension size to be"
                                  );
        pDVar3 = Debug::operator<<(pDVar3,value_00);
        pDVar3 = Debug::operator<<(pDVar3,"but got");
        Debug::operator<<(pDVar3,value_01);
      }
    }
    else {
      poVar4 = Error::defaultOutput();
      Error::Error(&local_70,poVar4,(Flags)0x0);
      pDVar3 = Debug::operator<<(&local_70.super_Debug,"Utility::copyMasked(): expected");
      pDVar3 = Debug::operator<<(pDVar3,(unsigned_long)value_02);
      pDVar3 = Debug::operator<<(pDVar3,"destination items but got");
      Debug::operator<<(pDVar3,puVar5[1]);
    }
  }
  else {
    poVar4 = Error::defaultOutput();
    Error::Error(&local_70,poVar4,(Flags)0x0);
    pDVar3 = Debug::operator<<(&local_70.super_Debug,
                               "Utility::copyMasked(): expected source mask size to be");
    pDVar3 = Debug::operator<<(pDVar3,value);
    pDVar3 = Debug::operator<<(pDVar3,"but got");
    Debug::operator<<(pDVar3,value_03);
  }
  Error::~Error(&local_70);
  abort();
}

Assistant:

void copyMasked(const Containers::StridedArrayView2D<const char>& src, const Containers::BitArrayView srcMask, const Containers::StridedArrayView2D<char>& dst) {
    const std::size_t srcSize = src.size()[0];
    CORRADE_ASSERT(srcSize == srcMask.size(),
        "Utility::copyMasked(): expected source mask size to be" << srcSize << "but got" << srcMask.size(), );
    #ifndef CORRADE_NO_ASSERT
    const std::size_t srcMaskCount = srcMask.count();
    #endif
    CORRADE_ASSERT(srcMaskCount == dst.size()[0],
        "Utility::copyMasked(): expected" << srcMaskCount << "destination items but got" << dst.size()[0], );
    const std::size_t srcTypeSize = src.size()[1];
    #ifndef CORRADE_NO_ASSERT
    const std::size_t dstTypeSize = dst.size()[1];
    #endif
    CORRADE_ASSERT(srcTypeSize == dstTypeSize,
        "Utility::copyMasked(): expected second destination dimension size to be" << srcTypeSize << "but got" << dstTypeSize, );
    CORRADE_ASSERT(src.isContiguous<1>(),
        "Utility::copyMasked(): second source view dimension is not contiguous", );
    CORRADE_ASSERT(dst.isContiguous<1>(),
        "Utility::copyMasked(): second destination view dimension is not contiguous", );

    const std::ptrdiff_t srcStride = src.stride()[0];
    const std::ptrdiff_t dstStride = dst.stride()[0];
    const char* srcPtr = static_cast<const char*>(src.data());
    char* dstPtr = static_cast<char*>(dst.data());
    /** @todo instead of iterating over all src items it could iterate over all
        dst, and then at the end assert that there's no bits left (or that
        there's still bit positions), which could avoid the otherwise
        unnecessary popcount */
    for(std::size_t i = 0; i != srcSize; ++i) {
        /** @todo some better way to iterate set bits */
        if(srcMask[i]) {
            std::memcpy(dstPtr, srcPtr, srcTypeSize);
            dstPtr += dstStride;
        }

        srcPtr += srcStride;
    }
}